

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

ParseNodePtr __thiscall Parser::ParseDefaultExportClause<false>(Parser *this)

{
  Scanner_t *this_00;
  tokens tVar1;
  IdentPtr pIVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ParseNodeClass *pPVar6;
  IdentPtr pIVar7;
  ParseNodePtr pPVar8;
  ModuleImportOrExportEntryList *importOrExportEntryList;
  ModuleImportOrExportEntry *importOrExportEntry;
  ushort uVar9;
  Parser *this_01;
  ushort uVar10;
  undefined1 auStack_68 [8];
  RestorePoint parsedClass;
  
  if ((this->m_token).tk != tkDEFAULT) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0xb32,"(m_token.tk == tkDEFAULT)","m_token.tk == tkDEFAULT");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  this_00 = &this->m_scan;
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  tVar1 = (this->m_token).tk;
  if (tVar1 == tkFUNCTION) {
    uVar10 = 0;
LAB_00e965d5:
    parsedClass.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
    parsedClass.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
    parsedClass.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
    auStack_68._0_4_ = 0xffffffff;
    auStack_68._4_4_ = 0xffffffff;
    parsedClass.m_ichMinTok = 0xffffffff;
    parsedClass.m_ichMinLine = 0xffffffff;
    parsedClass._20_16_ = (undefined1  [16])0x0;
    parsedClass.m_fHadEol = -1;
    parsedClass._44_4_ = 0xffffffff;
    Scanner<UTF8EncodingPolicyBase<false>_>::Capture(this_00,(RestorePoint *)auStack_68);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
    if ((this->m_token).tk == tkStar) {
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
    }
    uVar9 = 8;
    if ((this->m_token).tk == tkID) {
      uVar9 = 1;
    }
    Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(this_00,(RestorePoint *)auStack_68);
    pPVar6 = (ParseNodeClass *)ParseFncDeclCheckScope<false>(this,uVar10 | uVar9,true);
  }
  else {
    if (tVar1 == tkID) {
      if ((((this->m_scan).field_0x508 & 0x10) == 0) &&
         (pIVar2 = (this->wellKnownPropertyPids).async,
         pIVar7 = Token::GetIdentifier((Token *)&this->m_token,&(this->m_scan).m_htbl),
         pIVar7 == pIVar2)) {
        parsedClass.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
        parsedClass.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
        parsedClass.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
        auStack_68._0_4_ = 0xffffffff;
        auStack_68._4_4_ = 0xffffffff;
        parsedClass.m_ichMinTok = 0xffffffff;
        parsedClass.m_ichMinLine = 0xffffffff;
        parsedClass._20_16_ = (undefined1  [16])0x0;
        parsedClass.m_fHadEol = -1;
        parsedClass._44_4_ = 0xffffffff;
        Scanner<UTF8EncodingPolicyBase<false>_>::Capture(this_00,(RestorePoint *)auStack_68);
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
        uVar10 = 0x100;
        if ((this->m_token).tk == tkFUNCTION) goto LAB_00e965d5;
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(this_00,(RestorePoint *)auStack_68);
      }
    }
    else if (tVar1 == tkCLASS) {
      parsedClass.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
      parsedClass.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
      parsedClass.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
      auStack_68._0_4_ = 0xffffffff;
      auStack_68._4_4_ = 0xffffffff;
      parsedClass.m_ichMinTok = 0xffffffff;
      parsedClass.m_ichMinLine = 0xffffffff;
      parsedClass._20_16_ = (undefined1  [16])0x0;
      parsedClass.m_fHadEol = -1;
      parsedClass._44_4_ = 0xffffffff;
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture(this_00,(RestorePoint *)auStack_68);
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
      tVar1 = (this->m_token).tk;
      Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(this_00,(RestorePoint *)auStack_68);
      pPVar6 = ParseClassDecl<false>
                         (this,(uint)(tVar1 == tkID),(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0);
      goto LAB_00e96652;
    }
    pPVar6 = (ParseNodeClass *)0x0;
    this_01 = this;
    pPVar8 = ParseExpr<false>(this,0,(BOOL *)0x0,1,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                              (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
    if (pPVar8 != (ParseNodePtr)0x0) {
      if (pPVar8->nop == knopComma) {
        Error(this_01,-0x7ff5fc16,L"",L"");
      }
      pPVar6 = (ParseNodeClass *)0x0;
    }
  }
LAB_00e96652:
  pIVar2 = (this->wellKnownPropertyPids)._default;
  importOrExportEntryList = EnsureModuleLocalExportEntryList(this);
  importOrExportEntry =
       (ModuleImportOrExportEntry *)
       new<Memory::ArenaAllocator>(0x30,&this->m_nodeAllocator,0x366bee);
  importOrExportEntry->localName = (IdentPtr)0x0;
  importOrExportEntry->exportName = (IdentPtr)0x0;
  importOrExportEntry->moduleRequest = (IdentPtr)0x0;
  importOrExportEntry->importName = (IdentPtr)0x0;
  importOrExportEntry->pidRefStack = (PidRefStack *)0x0;
  importOrExportEntry->offset = 0;
  *(undefined4 *)&importOrExportEntry->field_0x2c = 0;
  importOrExportEntry->localName = pIVar2;
  importOrExportEntry->exportName = pIVar2;
  importOrExportEntry->moduleRequest = (IdentPtr)0x0;
  importOrExportEntry->pidRefStack = (PidRefStack *)0x0;
  importOrExportEntry->offset = 0;
  AddModuleImportOrExportEntry(this,importOrExportEntryList,importOrExportEntry);
  return &pPVar6->super_ParseNode;
}

Assistant:

ParseNodePtr Parser::ParseDefaultExportClause()
{
    Assert(m_token.tk == tkDEFAULT);

    this->GetScanner()->Scan();
    ParseNodePtr pnode = nullptr;
    ushort flags = fFncNoFlgs;

    switch (m_token.tk)
    {
    case tkCLASS:
    {

        // Before we parse the class itself we need to know if the class has an identifier name.
        // If it does, we'll treat this class as an ordinary class declaration which will bind
        // it to that name. Otherwise the class should parse as a nameless class expression and
        // bind only to the export binding.
        BOOL classHasName = false;
        RestorePoint parsedClass;
        this->GetScanner()->Capture(&parsedClass);
        this->GetScanner()->Scan();

        if (m_token.tk == tkID)
        {
            classHasName = true;
        }

        this->GetScanner()->SeekTo(parsedClass);
        ParseNodeClass * pnodeClass;
        pnode = pnodeClass = ParseClassDecl<buildAST>(classHasName, nullptr, nullptr, nullptr);

        if (buildAST)
        {
            AnalysisAssert(pnode != nullptr);
            Assert(pnode->nop == knopClassDecl);

            pnodeClass->SetIsDefaultModuleExport(true);
        }

        break;
    }
    case tkID:
        // If we parsed an async token, it could either modify the next token (if it is a
        // function token) or it could be an identifier (let async = 0; export default async;).
        // To handle both cases, when we parse an async token we need to keep the parser state
        // and rewind if the next token is not function.
        if (CheckContextualKeyword(wellKnownPropertyPids.async))
        {
            RestorePoint parsedAsync;
            this->GetScanner()->Capture(&parsedAsync);
            this->GetScanner()->Scan();
            if (m_token.tk == tkFUNCTION)
            {
                // Token after async is function, consume the async token and continue to parse the
                // function as an async function.
                flags |= fFncAsync;
                goto LFunction;
            }
            // Token after async is not function, no idea what the async token is supposed to mean
            // so rewind and let the default case handle it.
            this->GetScanner()->SeekTo(parsedAsync);
        }
        goto LDefault;
        break;
    case tkFUNCTION:
    {
    LFunction:
        // We just parsed a function token but we need to figure out if the function
        // has an identifier name or not before we call the helper.
        RestorePoint parsedFunction;
        this->GetScanner()->Capture(&parsedFunction);
        this->GetScanner()->Scan();

        if (m_token.tk == tkStar)
        {
            // If we saw 'function*' that indicates we are going to parse a generator,
            // but doesn't tell us if the generator has an identifier or not.
            // Skip the '*' token for now as it doesn't matter yet.
            this->GetScanner()->Scan();
        }

        // We say that if the function has an identifier name, it is a 'normal' declaration
        // and should create a binding to that identifier as well as one for our default export.
        if (m_token.tk == tkID)
        {
            flags |= fFncDeclaration;
        }
        else
        {
            flags |= fFncNoName;
        }

        // Rewind back to the function token and let the helper handle the parsing.
        this->GetScanner()->SeekTo(parsedFunction);
        pnode = ParseFncDeclCheckScope<buildAST>(flags);

        if (buildAST)
        {
            AnalysisAssert(pnode != nullptr);
            Assert(pnode->nop == knopFncDecl);

            pnode->AsParseNodeFnc()->SetIsDefaultModuleExport(true);
        }
        break;
    }
    default:
    LDefault:
    {
        ParseNodePtr pnodeExpression = ParseExpr<buildAST>();

        // Consider: Can we detect this syntax error earlier?
        if (pnodeExpression && pnodeExpression->nop == knopComma)
        {
            Error(ERRsyntax);
        }

        if (buildAST)
        {
            AnalysisAssert(pnodeExpression != nullptr);

            // Mark this node as the default module export. We need to make sure it is put into the correct
            // module export slot when we emit the node.
            ParseNodeExportDefault * pnodeExportDefault;
            pnode = pnodeExportDefault = CreateNodeForOpT<knopExportDefault>();
            pnode->AsParseNodeExportDefault()->pnodeExpr = pnodeExpression;
        }
        break;
    }
    }

    IdentPtr exportName = wellKnownPropertyPids._default;
    AddModuleImportOrExportEntry(EnsureModuleLocalExportEntryList(), nullptr, exportName, exportName, nullptr);

    return pnode;
}